

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O3

void bus0_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  long lVar1;
  nng_err nVar2;
  uint32_t uVar3;
  int iVar4;
  nni_msg *m;
  nni_aio *aio_00;
  size_t count;
  
  lVar1 = *(long *)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x70);
  nVar2 = nni_aio_result(aio);
  if (nVar2 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  uVar3 = nni_pipe_id(*arg);
  nni_msg_set_pipe(m,uVar3);
  mtx = (nni_mtx *)(lVar1 + 0x18);
  nni_mtx_lock(mtx);
  if (*(char *)(lVar1 + 0xc4) == '\x01') {
    uVar3 = nni_pipe_id(*arg);
    nni_msg_header_append_u32(m,uVar3);
  }
  iVar4 = nni_list_empty((nni_list *)(lVar1 + 0xa8));
  if (iVar4 == 0) {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)(lVar1 + 0xa8));
    nni_aio_list_remove(aio_00);
    nni_aio_set_msg(aio_00,m);
    nni_mtx_unlock(mtx);
    if (aio_00 != (nni_aio *)0x0) {
      count = nni_msg_len(m);
      nni_aio_finish_sync(aio_00,NNG_OK,count);
    }
  }
  else {
    iVar4 = nni_lmq_put((nni_lmq *)(lVar1 + 0x60),m);
    if (iVar4 == 0) {
      nni_pollable_raise((nni_pollable *)(lVar1 + 0x50));
    }
    else {
      nni_msg_free(m);
    }
    nni_mtx_unlock(mtx);
  }
  nni_pipe_recv(*arg,aio);
  return;
}

Assistant:

static void
bus0_pipe_recv_cb(void *arg)
{
	bus0_pipe *p   = arg;
	bus0_sock *s   = p->bus;
	nni_aio   *aio = NULL;
	nni_msg   *msg;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));

	nni_mtx_lock(&s->mtx);
	if (s->raw) {
		nni_msg_header_append_u32(msg, nni_pipe_id(p->pipe));
	}

	if (!nni_list_empty(&s->recv_wait)) {
		aio = nni_list_first(&s->recv_wait);
		nni_aio_list_remove(aio);
		nni_aio_set_msg(aio, msg);
	} else if (nni_lmq_put(&s->recv_msgs, msg) == 0) {
		nni_pollable_raise(&s->can_recv);
	} else {
		// dropped message due to no room
		nni_msg_free(msg);
	}
	nni_mtx_unlock(&s->mtx);

	if (aio != NULL) {
		nni_aio_finish_sync(aio, 0, nni_msg_len(msg));
	}
	bus0_pipe_recv(p);
}